

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O0

void __thiscall FlickerRemover::clear(FlickerRemover *this)

{
  UMat *local_20;
  UMat *to_delete_2;
  UMat *to_delete_1;
  FlickerRemover *this_local;
  
  to_delete_2 = CircularBuffer<cv::UMat_*>::pop(&this->corresponding_frames_similarity_levels);
  while (to_delete_2 != (UMat *)0x0) {
    if (to_delete_2 != (UMat *)0x0) {
      cv::UMat::~UMat(to_delete_2);
      operator_delete(to_delete_2,0x50);
    }
    to_delete_2 = CircularBuffer<cv::UMat_*>::pop(&this->corresponding_frames_similarity_levels);
  }
  local_20 = CircularBuffer<cv::UMat_*>::pop(&this->adjacent_frames_similarity_levels);
  while (local_20 != (UMat *)0x0) {
    if (local_20 != (UMat *)0x0) {
      cv::UMat::~UMat(local_20);
      operator_delete(local_20,0x50);
    }
    local_20 = CircularBuffer<cv::UMat_*>::pop(&this->adjacent_frames_similarity_levels);
  }
  return;
}

Assistant:

void FlickerRemover::clear() {
    auto to_delete_1 = corresponding_frames_similarity_levels.pop();
    while(to_delete_1 != nullptr) {
        delete to_delete_1;
        to_delete_1 = corresponding_frames_similarity_levels.pop();
    }
    auto to_delete_2 = adjacent_frames_similarity_levels.pop();
    while(to_delete_2 != nullptr) {
        delete to_delete_2;
        to_delete_2 = adjacent_frames_similarity_levels.pop();
    }
}